

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMDocumentImpl::setDocumentURI(DOMDocumentImpl *this,XMLCh *documentURI)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  XMLCh *target;
  
  if ((documentURI == (XMLCh *)0x0) || (*documentURI == L'\0')) {
    target = (XMLCh *)0x0;
  }
  else {
    XVar2 = XMLString::stringLen(documentURI);
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,XVar2 * 2 + 0x12);
    target = (XMLCh *)CONCAT44(extraout_var,iVar1);
    XMLString::fixURI(documentURI,target);
  }
  this->fDocumentURI = target;
  return;
}

Assistant:

void DOMDocumentImpl::setDocumentURI(const XMLCh* documentURI){
    if (documentURI && *documentURI) {
        XMLCh* temp = (XMLCh*) this->allocate((XMLString::stringLen(documentURI) + 9)*sizeof(XMLCh));
        XMLString::fixURI(documentURI, temp);
        fDocumentURI = temp;
    }
    else
        fDocumentURI = 0;
}